

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

int libssh2_sftp_unlink_ex(LIBSSH2_SFTP *sftp,char *filename,uint filename_len)

{
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *pLVar1;
  int iVar2;
  uint32_t uVar3;
  time_t start_time;
  ulong uVar4;
  char *errmsg;
  ulong buflen;
  uchar *s;
  size_t data_len;
  uchar *local_60;
  uchar *local_58;
  size_t local_50;
  ulong local_48;
  ulong local_40;
  char *local_38;
  
  if (sftp == (LIBSSH2_SFTP *)0x0) {
    return -0x27;
  }
  local_38 = filename;
  start_time = time((time_t *)0x0);
  local_48 = (ulong)filename_len;
  buflen = (ulong)(filename_len + 0xd);
  local_40 = (ulong)(filename_len + 9);
  do {
    channel = sftp->channel;
    pLVar1 = channel->session;
    local_50 = 0;
    local_60 = (uchar *)0x0;
    if (sftp->unlink_state == libssh2_NB_state_created) {
LAB_001263c8:
      uVar4 = _libssh2_channel_write(channel,0,sftp->unlink_packet,buflen);
      if (uVar4 != 0xffffffffffffffdb) {
        (*pLVar1->free)(sftp->unlink_packet,&pLVar1->abstract);
        sftp->unlink_packet = (uchar *)0x0;
        if (uVar4 == buflen) {
          sftp->unlink_state = libssh2_NB_state_sent;
          goto LAB_00126412;
        }
        sftp->unlink_state = libssh2_NB_state_idle;
        iVar2 = -7;
        errmsg = "Unable to send FXP_REMOVE command";
        goto LAB_001264fa;
      }
    }
    else {
      if (sftp->unlink_state == libssh2_NB_state_idle) {
        sftp->last_errno = 0;
        local_58 = (uchar *)(*pLVar1->alloc)(buflen,&pLVar1->abstract);
        sftp->unlink_packet = local_58;
        if (local_58 != (uchar *)0x0) {
          _libssh2_store_u32(&local_58,(uint32_t)local_40);
          *local_58 = '\r';
          uVar3 = sftp->request_id;
          sftp->request_id = uVar3 + 1;
          sftp->unlink_request_id = uVar3;
          local_58 = local_58 + 1;
          _libssh2_store_u32(&local_58,uVar3);
          _libssh2_store_str(&local_58,local_38,local_48);
          sftp->unlink_state = libssh2_NB_state_created;
          goto LAB_001263c8;
        }
        iVar2 = -6;
        errmsg = "Unable to allocate memory for FXP_REMOVE packet";
        local_58 = (uchar *)0x0;
      }
      else {
LAB_00126412:
        iVar2 = sftp_packet_require(sftp,'e',sftp->unlink_request_id,&local_60,&local_50,9);
        if (iVar2 == 0) {
          sftp->unlink_state = libssh2_NB_state_idle;
          uVar3 = _libssh2_ntohu32(local_60 + 5);
          (*pLVar1->free)(local_60,&pLVar1->abstract);
          if (uVar3 == 0) {
            return 0;
          }
          sftp->last_errno = uVar3;
          iVar2 = -0x1f;
          errmsg = "SFTP Protocol Error";
        }
        else {
          if (iVar2 == -0x25) goto LAB_00126504;
          if (iVar2 == -0x26) {
            if (local_50 != 0) {
              (*pLVar1->free)(local_60,&pLVar1->abstract);
            }
            iVar2 = -0x1f;
            errmsg = "SFTP unlink packet too short";
          }
          else {
            sftp->unlink_state = libssh2_NB_state_idle;
            errmsg = "Error waiting for FXP STATUS";
          }
        }
      }
LAB_001264fa:
      iVar2 = _libssh2_error(pLVar1,iVar2,errmsg);
      if (iVar2 != -0x25) {
        return iVar2;
      }
    }
LAB_00126504:
    pLVar1 = sftp->channel->session;
    if (pLVar1 == (LIBSSH2_SESSION *)0x0) {
      return -0x25;
    }
    if (pLVar1->api_block_mode == 0) {
      return -0x25;
    }
    iVar2 = _libssh2_wait_socket(pLVar1,start_time);
    if (iVar2 != 0) {
      return iVar2;
    }
  } while( true );
}

Assistant:

LIBSSH2_API int
libssh2_sftp_unlink_ex(LIBSSH2_SFTP *sftp, const char *filename,
                       unsigned int filename_len)
{
    int rc;
    if(!sftp)
        return LIBSSH2_ERROR_BAD_USE;
    BLOCK_ADJUST(rc, sftp->channel->session,
                 sftp_unlink(sftp, filename, filename_len));
    return rc;
}